

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O2

Symbol * __thiscall
slang::ast::anon_unknown_0::AnsiPortListBuilder::add
          (AnsiPortListBuilder *this,DeclaratorSyntax *decl,ArgumentDirection direction,
          DataTypeSyntax *type,NetType *netType,
          span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> attrs)

{
  string_view *args;
  ArgumentDirection AVar1;
  Compilation *this_00;
  EqualsValueClauseSyntax *this_01;
  Scope *this_02;
  ExpressionSyntax *pEVar2;
  ArgumentDirection AVar3;
  NetType *args_2;
  size_t sVar4;
  PortSymbol *this_03;
  Diagnostic *this_04;
  Symbol *pSVar5;
  SourceLocation SVar6;
  SourceLocation *args_1;
  DiagCode code;
  SourceRange sourceRange;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax;
  PortSymbol *port;
  bool local_69;
  SourceLocation local_68;
  ArgumentDirection local_5c;
  DataTypeSyntax *local_58;
  pointer local_50;
  NetType *local_48;
  string_view local_40;
  
  this_00 = this->comp;
  local_5c = direction;
  local_58 = type;
  local_48 = netType;
  local_40 = parsing::Token::valueText(&decl->name);
  local_68 = parsing::Token::location(&decl->name);
  local_69 = true;
  this_03 = BumpAllocator::
            emplace<slang::ast::PortSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,bool>
                      (&this_00->super_BumpAllocator,&local_40,&local_68,&local_69);
  args_2 = local_48;
  AVar3 = local_5c;
  local_40._M_len = (size_t)this_03;
  this_03->direction = local_5c;
  (this_03->super_Symbol).originatingSyntax = &decl->super_SyntaxNode;
  local_50 = attrs._M_ptr;
  Symbol::setAttributes(&this_03->super_Symbol,this->scope,attrs);
  if ((this_03->super_Symbol).name._M_len == 0) goto LAB_002049d2;
  AVar1 = this_03->direction;
  code.subsystem = Declarations;
  code.code = 0x49;
  if (args_2 != (NetType *)0x0 || AVar1 != InOut) {
    if (AVar1 == InOut) {
      code.subsystem = Declarations;
      code.code = 0x4a;
      if (args_2->netKind != UWire) goto LAB_002049d2;
    }
    else {
      code.subsystem = Declarations;
      code.code = 0xbc;
      if (AVar1 != Ref || args_2 == (NetType *)0x0) goto LAB_002049d2;
    }
  }
  this_04 = Scope::addDiag(this->scope,code,(this_03->super_Symbol).location);
  Diagnostic::operator<<(this_04,(this_03->super_Symbol).name);
LAB_002049d2:
  if (((((this->comp->options).flags.m_bits & 0x2000) != 0) &&
      (pSVar5 = Scope::find(this->scope,(this_03->super_Symbol).name), pSVar5 != (Symbol *)0x0)) &&
     (pSVar5->kind - Net < 2)) {
    this_03->internalSymbol = pSVar5;
  }
  if (this_03->internalSymbol == (Symbol *)0x0) {
    args = &(this_03->super_Symbol).name;
    args_1 = &(this_03->super_Symbol).location;
    if (args_2 == (NetType *)0x0) {
      local_68._0_4_ = 1;
      SVar6 = (SourceLocation)
              BumpAllocator::
              emplace<slang::ast::VariableSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::VariableLifetime>
                        (&this->comp->super_BumpAllocator,args,args_1,(VariableLifetime *)&local_68)
      ;
    }
    else {
      SVar6 = (SourceLocation)
              BumpAllocator::
              emplace<slang::ast::NetSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::NetType_const&>
                        (&this->comp->super_BumpAllocator,args,args_1,args_2);
    }
    local_68 = SVar6;
    if (local_58 == (DataTypeSyntax *)0x0) {
      if ((decl->dimensions).
          super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value != 0) {
        DeclaredType::setDimensionSyntax((DeclaredType *)((long)SVar6 + 0x40),&decl->dimensions);
        SVar6 = local_68;
      }
    }
    else {
      ValueSymbol::setDeclaredType((ValueSymbol *)SVar6,local_58,&decl->dimensions);
    }
    *(DeclaratorSyntax **)((long)SVar6 + 0x38) = decl;
    syntax._M_extent._M_extent_value = attrs._M_extent._M_extent_value;
    syntax._M_ptr = local_50;
    Symbol::setAttributes((Symbol *)SVar6,this->scope,syntax);
    *(SourceLocation *)(local_40._M_len + 0x40) = local_68;
    SmallVectorBase<std::pair<slang::ast::Symbol*,slang::ast::Symbol_const*>>::
    emplace_back<slang::ast::ValueSymbol*&,slang::ast::PortSymbol*&>
              ((SmallVectorBase<std::pair<slang::ast::Symbol*,slang::ast::Symbol_const*>> *)
               this->implicitMembers,(ValueSymbol **)&local_68,(PortSymbol **)&local_40);
  }
  sVar4 = local_40._M_len;
  this_01 = decl->initializer;
  if (this_01 != (EqualsValueClauseSyntax *)0x0) {
    if ((args_2 == (NetType *)0x0) || (args_2->netKind != Interconnect)) {
      pEVar2 = (this_01->expr).ptr;
      SVar6 = parsing::Token::location(&this_01->equals);
      *(ExpressionSyntax **)&((Symbol *)(sVar4 + 0x40))->indexInScope = pEVar2;
      ((Symbol *)(sVar4 + 0x40))->originatingSyntax = (SyntaxNode *)SVar6;
    }
    else {
      this_02 = this->scope;
      sourceRange = slang::syntax::SyntaxNode::sourceRange(&this_01->super_SyntaxNode);
      Scope::addDiag(this_02,(DiagCode)0x650005,sourceRange);
    }
  }
  this->lastDirection = AVar3;
  this->lastType = local_58;
  this->lastNetType = args_2;
  this->lastInterface = (DefinitionSymbol *)0x0;
  (this->lastModport)._M_len = 0;
  (this->lastModport)._M_str = "";
  this->lastGenericIface = false;
  return (Symbol *)local_40._M_len;
}

Assistant:

Symbol* add(const DeclaratorSyntax& decl, ArgumentDirection direction,
                const DataTypeSyntax* type, const NetType* netType,
                std::span<const AttributeInstanceSyntax* const> attrs) {
        auto port = comp.emplace<PortSymbol>(decl.name.valueText(), decl.name.location(),
                                             /* isAnsiPort */ true);
        port->direction = direction;
        port->setSyntax(decl);
        port->setAttributes(scope, attrs);

        if (!port->name.empty()) {
            if (port->direction == ArgumentDirection::InOut && !netType) {
                scope.addDiag(diag::InOutPortCannotBeVariable, port->location) << port->name;
            }
            else if (port->direction == ArgumentDirection::InOut &&
                     netType->netKind == NetType::UWire) {
                scope.addDiag(diag::InOutUWirePort, port->location) << port->name;
            }
            else if (port->direction == ArgumentDirection::Ref && netType) {
                scope.addDiag(diag::RefPortMustBeVariable, port->location) << port->name;
            }
        }

        // Support a compatibility option which allows ANSI ports to still look
        // up and connect to an identically named net or variable declared in
        // the definition body instead of creating a new symbol internally.
        if (comp.hasFlag(CompilationFlags::AllowMergingAnsiPorts)) {
            if (auto symbol = scope.find(port->name);
                symbol &&
                (symbol->kind == SymbolKind::Variable || symbol->kind == SymbolKind::Net)) {
                port->internalSymbol = symbol;
            }
        }

        // Create a new symbol to represent this port internally to the instance.
        if (!port->internalSymbol) {
            ValueSymbol* symbol;
            if (netType) {
                symbol = comp.emplace<NetSymbol>(port->name, port->location, *netType);
            }
            else {
                symbol = comp.emplace<VariableSymbol>(port->name, port->location,
                                                      VariableLifetime::Static);
            }

            if (type) {
                symbol->setDeclaredType(*type, decl.dimensions);
            }
            else {
                SLANG_ASSERT(netType);
                if (!decl.dimensions.empty())
                    symbol->getDeclaredType()->setDimensionSyntax(decl.dimensions);
            }

            symbol->setSyntax(decl);
            symbol->setAttributes(scope, attrs);
            port->internalSymbol = symbol;
            implicitMembers.emplace_back(symbol, port);
        }

        if (decl.initializer) {
            if (netType && netType->netKind == NetType::Interconnect) {
                scope.addDiag(diag::InterconnectInitializer, decl.initializer->sourceRange());
            }
            else {
                port->setInitializerSyntax(*decl.initializer->expr,
                                           decl.initializer->equals.location());
            }
        }

        // Remember the properties of this port in case the next port wants to inherit from it.
        lastDirection = direction;
        lastType = type;
        lastNetType = netType;
        lastInterface = nullptr;
        lastModport = ""sv;
        lastGenericIface = false;

        return port;
    }